

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void store_buffer_16bit_to_32bit_w16_avx2(__m256i *in,int32_t *out,int stride,int out_size)

{
  undefined1 auVar1 [32];
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long in_RDI;
  int i;
  int local_fc;
  undefined8 *local_f0;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  local_f0 = in_RSI;
  for (local_fc = 0; local_fc < in_ECX; local_fc = local_fc + 1) {
    auVar1 = vpmovsxwd_avx2(*(undefined1 (*) [16])(in_RDI + (long)local_fc * 0x20));
    local_80 = auVar1._0_8_;
    uStack_78 = auVar1._8_8_;
    uStack_70 = auVar1._16_8_;
    uStack_68 = auVar1._24_8_;
    *local_f0 = local_80;
    local_f0[1] = uStack_78;
    local_f0[2] = uStack_70;
    local_f0[3] = uStack_68;
    auVar1 = vpmovsxwd_avx2(*(undefined1 (*) [16])(in_RDI + 0x10 + (long)local_fc * 0x20));
    local_c0 = auVar1._0_8_;
    uStack_b8 = auVar1._8_8_;
    uStack_b0 = auVar1._16_8_;
    uStack_a8 = auVar1._24_8_;
    local_f0[4] = local_c0;
    local_f0[5] = uStack_b8;
    local_f0[6] = uStack_b0;
    local_f0[7] = uStack_a8;
    local_f0 = (undefined8 *)((long)local_f0 + (long)in_EDX * 4);
  }
  return;
}

Assistant:

static inline void store_buffer_16bit_to_32bit_w16_avx2(const __m256i *const in,
                                                        int32_t *out,
                                                        const int stride,
                                                        const int out_size) {
  for (int i = 0; i < out_size; ++i) {
    _mm256_store_si256((__m256i *)(out),
                       _mm256_cvtepi16_epi32(_mm256_castsi256_si128(in[i])));
    _mm256_store_si256(
        (__m256i *)(out + 8),
        _mm256_cvtepi16_epi32(_mm256_extracti128_si256(in[i], 1)));
    out += stride;
  }
}